

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O1

void string8_suite::test_two(void)

{
  value_type input [4];
  decoder decoder;
  undefined4 local_7c;
  long *local_78 [2];
  long local_68 [2];
  uchar local_54 [4];
  decoder local_50;
  
  local_50.input._M_str = local_54;
  local_54[0] = 0xa9;
  local_54[1] = '\x02';
  local_54[2] = 'A';
  local_54[3] = 'B';
  local_50.input._M_len = 4;
  local_50.current.view._M_len = 0;
  local_50.current.view._M_str = (uchar *)0x0;
  local_50.current.code = end;
  trial::protocol::bintoken::detail::decoder::next(&local_50);
  local_78[0] = (long *)CONCAT44(local_78[0]._4_4_,local_50.current.code);
  local_7c = 0xa9;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::code::value,trial::protocol::bintoken::token::code::value>
            ("decoder.code()","token::code::string8",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0x431,"void string8_suite::test_two()",local_78,&local_7c);
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<unsigned_char_const*>
            ((string *)local_78,local_50.current.view._M_str,
             local_50.current.view._M_str + local_50.current.view._M_len);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,std::__cxx11::string,char[3]>
            ("decoder.value<token::string>()","\"AB\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0x432,"void string8_suite::test_two()",(string *)local_78,"AB");
  if (local_78[0] != local_68) {
    operator_delete(local_78[0],local_68[0] + 1);
  }
  trial::protocol::bintoken::detail::decoder::next(&local_50);
  local_78[0] = (long *)CONCAT44(local_78[0]._4_4_,local_50.current.code);
  local_7c = 0;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::code::value,trial::protocol::bintoken::token::code::value>
            ("decoder.code()","token::code::end",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0x434,"void string8_suite::test_two()",local_78,&local_7c);
  return;
}

Assistant:

void test_two()
{
    const value_type input[] = { token::code::string8, 0x02, 0x41, 0x42 };
    format::detail::decoder decoder(input);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::string8);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.value<token::string>(), "AB");
    decoder.next();
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::end);
}